

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void __thiscall QPDF::calculateHSharedObject(QPDF *this,NewObjTable *new_obj,ObjTable *obj)

{
  pointer *ppHVar1;
  int *piVar2;
  int iVar3;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var4;
  pointer pHVar5;
  pointer pCVar6;
  long lVar7;
  iterator __position;
  int iVar8;
  int iVar9;
  Object *pOVar10;
  NewObject *this_00;
  qpdf_offset_t qVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  string local_58;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *local_38;
  
  _Var4._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pHVar5 = *(pointer *)
            &((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
             ((long)&(_Var4._M_head_impl)->shared_object_hints + 0x28))->
             super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
  ;
  if (*(pointer *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x30) != pHVar5) {
    *(pointer *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x30) = pHVar5;
  }
  pCVar6 = *(pointer *)
            &((vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_> *)
             ((long)&(_Var4._M_head_impl)->c_shared_object_data + 0x10))->
             super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
  ;
  if (*(pointer *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 0x18) == pCVar6) {
    uVar14 = 0;
    uVar12 = 0;
  }
  else {
    local_38 = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
               ((long)&(_Var4._M_head_impl)->shared_object_hints + 0x28);
    iVar8 = outputLengthNextN(this,pCVar6->object,1,new_obj,obj);
    lVar15 = 0;
    uVar14 = 0;
    iVar13 = iVar8;
    while( true ) {
      iVar9 = *(int *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 8);
      if (iVar9 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar9);
      }
      iVar9 = *(int *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 8);
      if ((ulong)(long)iVar9 <= uVar14) {
        pHVar5 = *(pointer *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x30);
        lVar15 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                             *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x28))->
                           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
        ;
        if (iVar9 < 0) {
          QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar9);
        }
        if (((long)pHVar5 - lVar15 >> 2) * -0x5555555555555555 -
            (long)*(int *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 8) != 0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"soe has wrong size after initialization","");
          stopOnError(this,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        iVar9 = *(int *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 4);
        iVar3 = *(int *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 8);
        *(int *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x14) = iVar3;
        *(int *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x10) = iVar9;
        if (iVar9 < iVar3) {
          pOVar10 = ObjTable<QPDFWriter::Object>::element
                              (&obj->super_ObjTable<QPDFWriter::Object>,
                               (long)((_Var4._M_head_impl)->c_shared_object_data).first_shared_obj);
          iVar9 = pOVar10->renumber;
          ((_Var4._M_head_impl)->shared_object_hints).first_shared_obj = iVar9;
          *(int *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x1c) = iVar13;
          this_00 = ObjTable<QPDFWriter::NewObject>::element
                              (&new_obj->super_ObjTable<QPDFWriter::NewObject>,(long)iVar9);
          qVar11 = QPDFXRefEntry::getOffset(&this_00->xref);
          *(qpdf_offset_t *)((long)&(_Var4._M_head_impl)->shared_object_hints + 8) = qVar11;
        }
        *(int *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x1c) = iVar13;
        iVar8 = nbits(iVar8 - iVar13);
        *(int *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x20) = iVar8;
        lVar15 = 0;
        uVar14 = 0;
        goto LAB_0021dcbc;
      }
      lVar7 = *(long *)&((vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                          *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 0x10))->
                        super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
      ;
      uVar12 = (long)*(pointer *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 0x18) - lVar7
               >> 2;
      if (uVar12 <= uVar14) break;
      iVar9 = outputLengthNextN(this,*(int *)(lVar7 + uVar14 * 4),1,new_obj,obj);
      if (iVar9 < iVar13) {
        iVar13 = iVar9;
      }
      if (iVar8 <= iVar9) {
        iVar8 = iVar9;
      }
      __position._M_current = *(pointer *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x30);
      if (__position._M_current ==
          *(pointer *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x38)) {
        std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::
        _M_realloc_insert<>(local_38,__position);
      }
      else {
        (__position._M_current)->nobjects_minus_one = 0;
        (__position._M_current)->delta_group_length = 0;
        (__position._M_current)->signature_present = 0;
        ppHVar1 = (pointer *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x30);
        *ppHVar1 = *ppHVar1 + 1;
      }
      lVar7 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                          *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x28))->
                        super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
      ;
      uVar12 = ((long)*(pointer *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x30) - lVar7
               >> 2) * -0x5555555555555555;
      if (uVar12 < uVar14 || uVar12 - uVar14 == 0) break;
      *(int *)(lVar7 + lVar15) = iVar9;
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0xc;
    }
  }
LAB_0021dda9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
             uVar12);
LAB_0021dcbc:
  iVar8 = *(int *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 8);
  if (iVar8 < 0) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar8);
  }
  if ((ulong)(long)*(int *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 8) <= uVar14) {
    return;
  }
  lVar7 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
                    ((long)&(_Var4._M_head_impl)->shared_object_hints + 0x28))->
                    super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
  ;
  uVar12 = ((long)*(pointer *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x30) - lVar7 >> 2
           ) * -0x5555555555555555;
  if (uVar12 < uVar14 || uVar12 - uVar14 == 0) goto LAB_0021dda9;
  if (*(int *)(lVar7 + lVar15) < iVar13) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"found too small group length while writing linearization data",
               "");
    stopOnError(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  lVar7 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
                    ((long)&(_Var4._M_head_impl)->shared_object_hints + 0x28))->
                    super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
  ;
  uVar12 = ((long)*(pointer *)((long)&(_Var4._M_head_impl)->shared_object_hints + 0x30) - lVar7 >> 2
           ) * -0x5555555555555555;
  if (uVar12 < uVar14 || uVar12 - uVar14 == 0) goto LAB_0021dda9;
  piVar2 = (int *)(lVar7 + lVar15);
  *piVar2 = *piVar2 - iVar13;
  uVar14 = uVar14 + 1;
  lVar15 = lVar15 + 0xc;
  goto LAB_0021dcbc;
}

Assistant:

void
QPDF::calculateHSharedObject(
    QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    CHSharedObject& cso = m->c_shared_object_data;
    std::vector<CHSharedObjectEntry>& csoe = cso.entries;
    HSharedObject& so = m->shared_object_hints;
    std::vector<HSharedObjectEntry>& soe = so.entries;
    soe.clear();

    int min_length = outputLengthNextN(csoe.at(0).object, 1, new_obj, obj);
    int max_length = min_length;

    for (size_t i = 0; i < toS(cso.nshared_total); ++i) {
        // Assign absolute numbers to deltas; adjust later
        int length = outputLengthNextN(csoe.at(i).object, 1, new_obj, obj);
        min_length = std::min(min_length, length);
        max_length = std::max(max_length, length);
        soe.emplace_back();
        soe.at(i).delta_group_length = length;
    }
    if (soe.size() != toS(cso.nshared_total)) {
        stopOnError("soe has wrong size after initialization");
    }

    so.nshared_total = cso.nshared_total;
    so.nshared_first_page = cso.nshared_first_page;
    if (so.nshared_total > so.nshared_first_page) {
        so.first_shared_obj = obj[cso.first_shared_obj].renumber;
        so.min_group_length = min_length;
        so.first_shared_offset = new_obj[so.first_shared_obj].xref.getOffset();
    }
    so.min_group_length = min_length;
    so.nbits_delta_group_length = nbits(max_length - min_length);

    for (size_t i = 0; i < toS(cso.nshared_total); ++i) {
        // Adjust deltas
        if (soe.at(i).delta_group_length < min_length) {
            stopOnError("found too small group length while writing linearization data");
        }
        soe.at(i).delta_group_length -= min_length;
    }
}